

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::SGDOptimizer::SharedCtor(SGDOptimizer *this)

{
  *(undefined8 *)((long)&this->minibatchsize_ + 4) = 0;
  *(undefined8 *)((long)&this->momentum_ + 4) = 0;
  this->learningrate_ = (DoubleParameter *)0x0;
  this->minibatchsize_ = (Int64Parameter *)0x0;
  return;
}

Assistant:

void SGDOptimizer::SharedCtor() {
  ::memset(&learningrate_, 0, reinterpret_cast<char*>(&momentum_) -
    reinterpret_cast<char*>(&learningrate_) + sizeof(momentum_));
  _cached_size_ = 0;
}